

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper<char>::output_asc(ostream *os,char *first,char *last)

{
  bool bVar1;
  char local_39;
  char *pcStack_28;
  char c;
  uint8_t *p;
  char *last_local;
  char *first_local;
  ostream *os_local;
  
  for (pcStack_28 = first; pcStack_28 < last; pcStack_28 = pcStack_28 + 1) {
    local_39 = *pcStack_28;
    bVar1 = isprintable(local_39);
    if (!bVar1) {
      local_39 = '.';
    }
    std::operator<<(os,local_39);
  }
  return;
}

Assistant:

static void output_asc(std::ostream& os, const T*first, const T*last)
    {
        const uint8_t* p = (const uint8_t*)first;
        while (p < (const uint8_t*)last)
        {
            char c = *p;
            os << (isprintable(c) ? c : '.');

            ++p;
        }
    }